

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O0

void sfd_tran_pipe_nego_cb(void *arg)

{
  sfd_tran_ep *ep_00;
  nni_aio *pnVar1;
  size_t sVar2;
  undefined1 local_58 [8];
  nni_iov iov_1;
  nni_iov iov;
  int rv;
  nni_aio *uaio;
  nni_aio *aio;
  sfd_tran_ep *ep;
  sfd_tran_pipe *p;
  void *arg_local;
  
  ep_00 = *(sfd_tran_ep **)((long)arg + 0x38);
  pnVar1 = (nni_aio *)((long)arg + 0x430);
  nni_mtx_lock(&ep_00->mtx);
  if ((ep_00->closed & 1U) == 0) {
    iov.iov_len._4_4_ = nni_aio_result(pnVar1);
    if (iov.iov_len._4_4_ == NNG_OK) {
      if (*(ulong *)((long)arg + 0x50) < *(ulong *)((long)arg + 0x60)) {
        sVar2 = nni_aio_count(pnVar1);
        *(size_t *)((long)arg + 0x50) = sVar2 + *(long *)((long)arg + 0x50);
      }
      else if (*(ulong *)((long)arg + 0x58) < *(ulong *)((long)arg + 0x68)) {
        sVar2 = nni_aio_count(pnVar1);
        *(size_t *)((long)arg + 0x58) = sVar2 + *(long *)((long)arg + 0x58);
      }
      if (*(ulong *)((long)arg + 0x50) < *(ulong *)((long)arg + 0x60)) {
        iov_1.iov_len = (long)arg + *(long *)((long)arg + 0x50) + 0x40;
        nni_aio_set_iov(pnVar1,1,(nni_iov *)&iov_1.iov_len);
        nng_stream_send(*arg,pnVar1);
        nni_mtx_unlock(&ep_00->mtx);
        return;
      }
      if (*(ulong *)((long)arg + 0x58) < *(ulong *)((long)arg + 0x68)) {
        iov_1.iov_buf = (void *)(*(long *)((long)arg + 0x68) - *(long *)((long)arg + 0x58));
        local_58 = (undefined1  [8])((long)arg + *(long *)((long)arg + 0x58) + 0x48);
        nni_aio_set_iov(pnVar1,1,(nni_iov *)local_58);
        nng_stream_recv(*arg,pnVar1);
        nni_mtx_unlock(&ep_00->mtx);
        return;
      }
      if ((((*(char *)((long)arg + 0x48) == '\0') && (*(char *)((long)arg + 0x49) == 'S')) &&
          (*(char *)((long)arg + 0x4a) == 'P')) &&
         (((*(char *)((long)arg + 0x4b) == '\0' && (*(char *)((long)arg + 0x4e) == '\0')) &&
          (*(char *)((long)arg + 0x4f) == '\0')))) {
        *(ushort *)((long)arg + 0x10) =
             (ushort)*(byte *)((long)arg + 0x4c) * 0x100 + (ushort)*(byte *)((long)arg + 0x4d);
        nni_list_remove(&ep_00->negopipes,arg);
        nni_list_append(&ep_00->waitpipes,arg);
        sfd_tran_ep_match(ep_00);
        nni_mtx_unlock(&ep_00->mtx);
        return;
      }
      iov.iov_len._4_4_ = NNG_EPROTO;
    }
  }
  else {
    iov.iov_len._4_4_ = NNG_ECLOSED;
  }
  if (iov.iov_len._4_4_ == NNG_ECLOSED) {
    iov.iov_len._4_4_ = NNG_ECONNSHUT;
  }
  nng_stream_close(*arg);
  pnVar1 = ep_00->useraio;
  if (pnVar1 != (nni_aio *)0x0) {
    ep_00->useraio = (nni_aio *)0x0;
    nni_aio_finish_error(pnVar1,iov.iov_len._4_4_);
  }
  nni_mtx_unlock(&ep_00->mtx);
  nni_pipe_close(*(nni_pipe **)((long)arg + 8));
  nni_pipe_rele(*(nni_pipe **)((long)arg + 8));
  return;
}

Assistant:

static void
sfd_tran_pipe_nego_cb(void *arg)
{
	sfd_tran_pipe *p   = arg;
	sfd_tran_ep   *ep  = p->ep;
	nni_aio       *aio = &p->negoaio;
	nni_aio       *uaio;
	int            rv;

	nni_mtx_lock(&ep->mtx);
	if (ep->closed) {
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	// We start transmitting before we receive.
	if (p->gottxhead < p->wanttxhead) {
		p->gottxhead += nni_aio_count(aio);
	} else if (p->gotrxhead < p->wantrxhead) {
		p->gotrxhead += nni_aio_count(aio);
	}

	if (p->gottxhead < p->wanttxhead) {
		nni_iov iov;
		iov.iov_len = p->wanttxhead - p->gottxhead;
		iov.iov_buf = &p->txlen[p->gottxhead];
		// send it down...
		nni_aio_set_iov(aio, 1, &iov);
		nng_stream_send(p->conn, aio);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (p->gotrxhead < p->wantrxhead) {
		nni_iov iov;
		iov.iov_len = p->wantrxhead - p->gotrxhead;
		iov.iov_buf = &p->rxlen[p->gotrxhead];
		nni_aio_set_iov(aio, 1, &iov);
		nng_stream_recv(p->conn, aio);
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	// We have both sent and received the headers.  Let's check the
	// receiver.
	if ((p->rxlen[0] != 0) || (p->rxlen[1] != 'S') ||
	    (p->rxlen[2] != 'P') || (p->rxlen[3] != 0) || (p->rxlen[6] != 0) ||
	    (p->rxlen[7] != 0)) {
		rv = NNG_EPROTO;
		goto error;
	}

	NNI_GET16(&p->rxlen[4], p->peer);

	// We are ready now.  We put this in the wait list, and
	// then try to run the matcher.
	nni_list_remove(&ep->negopipes, p);
	nni_list_append(&ep->waitpipes, p);

	sfd_tran_ep_match(ep);
	nni_mtx_unlock(&ep->mtx);

	return;

error:
	// If the connection is closed, we need to pass back a different
	// error code.  This is necessary to avoid a problem where the
	// closed status is confused with the accept file descriptor
	// being closed.
	if (rv == NNG_ECLOSED) {
		rv = NNG_ECONNSHUT;
	}
	nng_stream_close(p->conn);

	if ((uaio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(uaio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
	nni_pipe_close(p->npipe);
	nni_pipe_rele(p->npipe);
}